

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_generator.hpp
# Opt level: O3

node_pointer __thiscall
ranger::bhvr_tree::
xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
::generate_node(xml_generator<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_true_node,_false_node>
                *this,undefined8 param_2,xml_node<char> *param_3)

{
  char *pcVar1;
  int iVar2;
  xml_attribute<char> *pxVar3;
  _func_int **pp_Var4;
  char *__s1;
  bool bVar5;
  
  bVar5 = false;
  pxVar3 = rapidxml::xml_node<char>::first_attribute(param_3,"expected",0,true);
  if (pxVar3 != (xml_attribute<char> *)0x0) {
    pcVar1 = (pxVar3->super_xml_base<char>).m_value;
    __s1 = &rapidxml::xml_base<char>::nullstr()::zero;
    if (pcVar1 != (char *)0x0) {
      __s1 = pcVar1;
    }
    iVar2 = strcmp(__s1,"true");
    bVar5 = iVar2 == 0;
  }
  pp_Var4 = (_func_int **)operator_new(0x28);
  pp_Var4[1] = (_func_int *)0x0;
  pp_Var4[2] = (_func_int *)0x0;
  pp_Var4[3] = (_func_int *)0x0;
  *pp_Var4 = (_func_int *)&PTR__abstract_node_0016f258;
  *(bool *)(pp_Var4 + 4) = bVar5;
  (this->super_template_extend<true_node,_false_node>).super_generator_interface<_86869e04_>.
  super_generator_unit<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>,_rapidxml::xml_node<char>_*,_ranger::bhvr_tree::selector_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>
  ._vptr_generator_unit = pp_Var4;
  return (__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
          )(__uniq_ptr_data<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>,_std::default_delete<ranger::bhvr_tree::abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_>,_true,_true>
            )this;
}

Assistant:

node_pointer generate_node(rapidxml::xml_node<>* data,
                             generate_node_type<decorator_until_node<AgentProxy>>) const final {
    bool expected = false;

    auto attr = data->first_attribute("expected");
    if (attr && strcmp(attr->value(), "true") == 0) {
      expected = true;
    }

    return node_pointer(new decorator_until_node<AgentProxy>(expected));
  }